

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsetable.cpp
# Opt level: O2

void __thiscall ParseTable::operator()(ParseTable *this,Automaton *aut)

{
  StateList *pSVar1;
  debug_infot *pdVar2;
  long lVar3;
  Grammar *this_00;
  _List_node_base *this_01;
  bool bVar4;
  int iVar5;
  QTextStream *pQVar6;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  *ns;
  iterator iVar7;
  iterator iVar8;
  ptrdiff_t pVar9;
  _Base_ptr p_Var10;
  bool bVar11;
  int iVar12;
  _List_node_base *p_Var13;
  long in_FS_OFFSET;
  _List_iterator<Item> local_a0;
  _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  local_98;
  set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
  lookaheads;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = aut->_M_grammar;
  pdVar2 = &this_00->rules;
  p_Var13 = (_List_node_base *)pdVar2;
  iVar12 = 1;
  while( true ) {
    p_Var13 = (((_List_base<Rule,_std::allocator<Rule>_> *)&p_Var13->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    if (p_Var13 == (_List_node_base *)pdVar2) break;
    pQVar6 = (QTextStream *)QTextStream::operator<<(this->out,iVar12);
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,")\t");
    pQVar6 = operator<<(pQVar6,(Rule *)(p_Var13 + 1));
    Qt::endl(pQVar6);
    iVar12 = iVar12 + 1;
  }
  pQVar6 = (QTextStream *)Qt::endl(this->out);
  Qt::endl(pQVar6);
  pSVar1 = &aut->states;
  iVar12 = 0;
  p_Var13 = (_List_node_base *)pSVar1;
  while (p_Var13 = (((_List_base<State,_std::allocator<State>_> *)&p_Var13->_M_next)->_M_impl).
                   _M_node.super__List_node_base._M_next, p_Var13 != (_List_node_base *)pSVar1) {
    pQVar6 = (QTextStream *)QTextStream::operator<<(this->out,"state ");
    pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,iVar12);
    pQVar6 = (QTextStream *)Qt::endl(pQVar6);
    Qt::endl(pQVar6);
    lookaheads._M_t._M_impl._0_8_ = p_Var13 + 1;
    while (lookaheads._M_t._M_impl._0_8_ =
                ((_List_node_base *)lookaheads._M_t._M_impl._0_8_)->_M_next,
          (_List_node_base *)lookaheads._M_t._M_impl._0_8_ != p_Var13 + 1) {
      pQVar6 = (QTextStream *)QTextStream::operator<<(this->out," *  ");
      operator<<(pQVar6,(Item *)(lookaheads._M_t._M_impl._0_8_ + 0x10));
      if (*(long *)(lookaheads._M_t._M_impl._0_8_ + 0x18) ==
          *(long *)(lookaheads._M_t._M_impl._0_8_ + 0x10) + 0x18) {
        pQVar6 = (QTextStream *)QTextStream::operator<<(this->out," ");
        ns = QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
             ::operator[](&aut->lookaheads,(_List_iterator<Item> *)&lookaheads);
        operator<<(pQVar6,ns);
      }
      Qt::endl(this->out);
    }
    this_01 = p_Var13 + 4;
    iVar7._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01);
    bVar11 = true;
    while( true ) {
      iVar8 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                        ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01)
      ;
      if ((iterator)iVar7._M_node == iVar8.i._M_node) break;
      bVar4 = Grammar::isTerminal(this_00,*(_List_node_base **)(iVar7._M_node + 1));
      if (bVar4) {
        if (bVar11) {
          Qt::endl(this->out);
        }
        pQVar6 = (QTextStream *)QTextStream::operator<<(this->out,"    ");
        pQVar6 = (QTextStream *)
                 QTextStream::operator<<(pQVar6,(QString *)(*(long *)(iVar7._M_node + 1) + 0x10));
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," shift, and go to state ");
        pVar9 = std::__distance<State>
                          ((pSVar1->super__List_base<State,_std::allocator<State>_>)._M_impl._M_node
                           .super__List_node_base._M_next,iVar7._M_node[1]._M_parent);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,pVar9);
        Qt::endl(pQVar6);
        bVar11 = false;
      }
      iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node);
    }
    bVar11 = true;
    local_a0._M_node = (_List_node_base *)((long)(p_Var13 + 1 + 1) + 8U);
    while( true ) {
      local_a0._M_node = (local_a0._M_node)->_M_next;
      if (local_a0._M_node == (_List_node_base *)((long)(p_Var13 + 1 + 1) + 8U)) break;
      if ((local_a0._M_node[1]._M_prev == (_List_node_base *)&local_a0._M_node[1]._M_next[1]._M_prev
          ) && (local_a0._M_node[1]._M_next != *(_List_node_base **)((long)(p_Var13 + 4 + 1) + 8)))
      {
        if (bVar11) {
          Qt::endl(this->out);
        }
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_node_count = 0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl._0_8_ = 0xaaaaaaaaaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_color = 0xaaaaaaaa;
        lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xaaaaaaaa;
        local_98._M_impl._0_8_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_98._M_impl.super__Rb_tree_header._M_header;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right =
             local_98._M_impl.super__Rb_tree_header._M_header._M_left;
        QMap<std::_List_iterator<Item>,_std::set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>_>
        ::value(&lookaheads,&aut->lookaheads,&local_a0,
                (set<std::_List_iterator<QString>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
                 *)&local_98);
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~_Rb_tree(&local_98);
        for (p_Var10 = lookaheads._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var10 != &lookaheads._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          pQVar6 = (QTextStream *)QTextStream::operator<<(this->out,"    ");
          pQVar6 = (QTextStream *)
                   QTextStream::operator<<(pQVar6,(QString *)(*(long *)(p_Var10 + 1) + 0x10));
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," reduce using rule ");
          iVar5 = Automaton::id(aut,local_a0._M_node[1]._M_next);
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,iVar5);
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," (");
          pQVar6 = (QTextStream *)
                   QTextStream::operator<<
                             (pQVar6,(QString *)
                                     ((long)local_a0._M_node[1]._M_next[1]._M_next + 0x10));
          pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,")");
          Qt::endl(pQVar6);
        }
        std::
        _Rb_tree<std::_List_iterator<QString>,_std::_List_iterator<QString>,_std::_Identity<std::_List_iterator<QString>_>,_std::less<std::_List_iterator<QString>_>,_std::allocator<std::_List_iterator<QString>_>_>
        ::~_Rb_tree(&lookaheads._M_t);
        bVar11 = false;
      }
    }
    iVar7._M_node =
         (_Base_ptr)
         QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::begin
                   ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01);
    bVar11 = true;
    while( true ) {
      iVar8 = QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_>::end
                        ((QMap<std::_List_iterator<QString>,_std::_List_iterator<State>_> *)this_01)
      ;
      if ((iterator)iVar7._M_node == iVar8.i._M_node) break;
      bVar4 = Grammar::isNonTerminal(this_00,*(_List_node_base **)(iVar7._M_node + 1));
      if (bVar4) {
        if (bVar11) {
          Qt::endl(this->out);
        }
        pQVar6 = (QTextStream *)QTextStream::operator<<(this->out,"    ");
        pQVar6 = (QTextStream *)
                 QTextStream::operator<<(pQVar6,(QString *)(*(long *)(iVar7._M_node + 1) + 0x10));
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," go to state ");
        pVar9 = std::__distance<State>
                          ((pSVar1->super__List_base<State,_std::allocator<State>_>)._M_impl._M_node
                           .super__List_node_base._M_next,iVar7._M_node[1]._M_parent);
        pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,pVar9);
        Qt::endl(pQVar6);
        bVar11 = false;
      }
      iVar7._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar7._M_node);
    }
    if ((debug_infot *)*(undefined1 **)((long)(p_Var13 + 4 + 1) + 8) != pdVar2) {
      pQVar6 = (QTextStream *)Qt::endl(this->out);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,"    $default reduce using rule ");
      iVar5 = Automaton::id(aut,*(_List_node_base **)((long)(p_Var13 + 4 + 1) + 8));
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,iVar5);
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6," (");
      pQVar6 = (QTextStream *)
               QTextStream::operator<<
                         (pQVar6,(QString *)
                                 (*(long *)(*(long *)((long)(p_Var13 + 4 + 1) + 8) + 0x10) + 0x10));
      pQVar6 = (QTextStream *)QTextStream::operator<<(pQVar6,")");
      Qt::endl(pQVar6);
    }
    iVar12 = iVar12 + 1;
    Qt::endl(this->out);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ParseTable::operator () (Automaton *aut)
{
  Grammar *g = aut->_M_grammar;

  int rindex = 1;
  for (RulePointer rule = g->rules.begin (); rule != g->rules.end (); ++rule)
    out << rindex++ << ")\t" << *rule << Qt::endl;
  out << Qt::endl << Qt::endl;

  int index = 0;
  for (StatePointer state = aut->states.begin (); state != aut->states.end (); ++state)
    {
      out << "state " << index++ << Qt::endl << Qt::endl;

      for (ItemPointer item = state->kernel.begin (); item != state->kernel.end (); ++item)
        {
          out << " *  " << *item;

          if (item->dot == item->end_rhs ())
            out << " " << aut->lookaheads [item];

          out << Qt::endl;
        }

      bool first = true;
      for (Bundle::iterator arrow = state->bundle.begin (); arrow != state->bundle.end (); ++arrow)
        {
          if (! g->isTerminal (arrow.key ()))
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          out << "    " << *arrow.key () << " shift, and go to state " << std::distance (aut->states.begin (), *arrow) << Qt::endl;
        }

      first = true;
      for (ItemPointer item = state->closure.begin (); item != state->closure.end (); ++item)
        {
          if (item->dot != item->end_rhs () || item->rule == state->defaultReduce)
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          const auto lookaheads = aut->lookaheads.value(item);
          for (const Name &la : lookaheads)
            out << "    " << *la << " reduce using rule " << aut->id (item->rule) << " (" << *item->rule->lhs << ")" << Qt::endl;
        }

      first = true;
      for (Bundle::iterator arrow = state->bundle.begin (); arrow != state->bundle.end (); ++arrow)
        {
          if (! g->isNonTerminal (arrow.key ()))
            continue;

          if (first)
            out << Qt::endl;

          first = false;

          out << "    " << *arrow.key () << " go to state " << std::distance (aut->states.begin (), *arrow) << Qt::endl;
        }

      if (state->defaultReduce != g->rules.end ())
        {
          out << Qt::endl
              << "    $default reduce using rule " << aut->id (state->defaultReduce) << " (" << *state->defaultReduce->lhs << ")" << Qt::endl;
        }

      out << Qt::endl;
    }
}